

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keysections.cpp
# Opt level: O1

void DoSaveKeys(FConfigFile *config,char *section,FKeySection *keysection,bool dbl)

{
  undefined3 in_register_00000009;
  long lVar1;
  ulong uVar2;
  FKeyBindings *this;
  
  FConfigFile::SetSection(config,section,true);
  FConfigFile::ClearCurrentSection(config);
  if (CONCAT31(in_register_00000009,dbl) == 0) {
    this = &Bindings;
  }
  else {
    this = &DoubleBindings;
  }
  if ((keysection->mActions).Count != 0) {
    lVar1 = 8;
    uVar2 = 0;
    do {
      FKeyBindings::ArchiveBindings
                (this,config,
                 *(char **)((long)&(((keysection->mActions).Array)->mTitle).Chars + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < (keysection->mActions).Count);
  }
  return;
}

Assistant:

static void DoSaveKeys (FConfigFile *config, const char *section, FKeySection *keysection, bool dbl)
{
	config->SetSection (section, true);
	config->ClearCurrentSection ();
	FKeyBindings *bindings = dbl? &DoubleBindings : &Bindings;
	for (unsigned i = 0; i < keysection->mActions.Size(); ++i)
	{
		bindings->ArchiveBindings (config, keysection->mActions[i].mAction);
	}
}